

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

void do_sysex_gm_reset(_mdi *mdi,_event_data *data)

{
  _patch *p_Var1;
  int local_1c;
  int i;
  _event_data *data_local;
  _mdi *mdi_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    mdi->channel[local_1c].bank = '\0';
    if (local_1c == 9) {
      mdi->channel[9].patch = (_patch *)0x0;
    }
    else {
      p_Var1 = get_patch_data(0);
      mdi->channel[local_1c].patch = p_Var1;
    }
    mdi->channel[local_1c].hold = '\0';
    mdi->channel[local_1c].volume = 'd';
    mdi->channel[local_1c].pressure = '\x7f';
    mdi->channel[local_1c].expression = '\x7f';
    mdi->channel[local_1c].balance = '@';
    mdi->channel[local_1c].pan = '@';
    mdi->channel[local_1c].pitch = 0;
    mdi->channel[local_1c].pitch_range = 200;
    mdi->channel[local_1c].reg_data = 0xffff;
    mdi->channel[local_1c].isdrum = '\0';
  }
  _WM_AdjustChannelVolumes(mdi,'\x10');
  mdi->channel[9].isdrum = '\x01';
  return;
}

Assistant:

static void do_sysex_gm_reset(struct _mdi *mdi, struct _event_data *data) {
	int i;
	for (i = 0; i < 16; i++) {
		mdi->channel[i].bank = 0;
		if (i != 9) {
			mdi->channel[i].patch = get_patch_data(0);
		} else {
			mdi->channel[i].patch = NULL;
		}
		mdi->channel[i].hold = 0;
		mdi->channel[i].volume = 100;
		mdi->channel[i].pressure = 127;
		mdi->channel[i].expression = 127;
		mdi->channel[i].balance = 64;
		mdi->channel[i].pan = 64;
		mdi->channel[i].pitch = 0;
		mdi->channel[i].pitch_range = 200;
		mdi->channel[i].reg_data = 0xFFFF;
		mdi->channel[i].isdrum = 0;
	}
	/* I would not expect notes to be active when this event
	 triggers but we'll adjust active notes as well just in case */
	_WM_AdjustChannelVolumes(mdi,16); // A setting > 15 adjusts all channels

	mdi->channel[9].isdrum = 1;
	UNUSED(data); /* NOOP, to please the compiler gods */
}